

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

bool __thiscall I2Cdev::writeWords(I2Cdev *this,uint16_t regAddr,uint8_t length,uint16_t *data)

{
  FILE *pFVar1;
  uint __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  byte length_00;
  ulong uVar5;
  I2Cdev *this_00;
  i2c_rdwr_ioctl_data msgset;
  i2c_msg msgs [2];
  uint8_t buf [128];
  
  uVar5 = CONCAT71(in_register_00000011,length) & 0xffffffff;
  length_00 = (byte)uVar5;
  if (length_00 < 0x40) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    pFVar1 = _stderr;
    if ((int)__fd < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Failed to open device: %s\n",pcVar4);
    }
    else {
      this_00 = (I2Cdev *)(ulong)__fd;
      iVar2 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Failed to select device: %s\n",pcVar4);
      }
      else {
        buf._0_2_ = regAddr << 8 | regAddr >> 8;
        bswap_table(this_00,length_00,data);
        memcpy(buf + 2,data,(ulong)(uint)((int)CONCAT71(in_register_00000011,length) * 2));
        ioctl(__fd,0x707);
      }
      close(__fd);
    }
  }
  else {
    fprintf(_stderr,"Word write count (%d) > 63\n",uVar5);
  }
  return length_00 < 0x40;
}

Assistant:

bool I2Cdev::writeWords(uint16_t regAddr, uint8_t length, uint16_t* data) {
    int8_t count = 0;
    uint8_t buf[128];

    if (length > 63) {
        fprintf(stderr, "Word write count (%d) > 63\n", length);
        return(FALSE);
    }

    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }

    int err;
    buf[0] = (uint8_t)(regAddr >> 8);
    buf[1] = (uint8_t)(regAddr & 0xff);

    //Convert little to big endian
    bswap_table(length, data);
    /*for (unsigned int i = 0; i < length; i++) {
        buf[i*2+2] = data[i] >> 8;
        buf[i*2+3] = data[i];
    }*/
    memcpy(buf+2, data, length*2);

    struct i2c_rdwr_ioctl_data msgset;
    struct i2c_msg msgs[2] = {
        {
            .addr = this->address,
            .flags = 0,
            .len = (uint8_t)(2 + length*2),
            .buf = buf,
        }
    };

    msgset.msgs = msgs;
    msgset.nmsgs = 1;

    err = ioctl(fd, I2C_RDWR, &msgset);
    close(fd);

    return TRUE;
}